

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

boolean donning_off(obj *otmp)

{
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  obj *otmp_local;
  
  if (otmp == uarm) {
    local_19 = afternmv == Armor_off || taking_off == 1;
    otmp_local._7_1_ = local_19;
  }
  else if (otmp == uarmu) {
    local_1a = afternmv == Shirt_off || taking_off == 0x40;
    otmp_local._7_1_ = local_1a;
  }
  else if (otmp == uarmc) {
    local_1b = afternmv == Cloak_off || taking_off == 2;
    otmp_local._7_1_ = local_1b;
  }
  else if (otmp == uarmf) {
    local_1c = afternmv == Boots_off || taking_off == 0x20;
    otmp_local._7_1_ = local_1c;
  }
  else if (otmp == uarmh) {
    local_1d = afternmv == Helmet_off || taking_off == 4;
    otmp_local._7_1_ = local_1d;
  }
  else if (otmp == uarmg) {
    local_1e = afternmv == Gloves_off || taking_off == 0x10;
    otmp_local._7_1_ = local_1e;
  }
  else if (otmp == uarms) {
    local_1f = afternmv == Shield_off || taking_off == 8;
    otmp_local._7_1_ = local_1f;
  }
  else {
    otmp_local._7_1_ = false;
  }
  return otmp_local._7_1_;
}

Assistant:

boolean donning_off(const struct obj *otmp)
{
	/* if taking_off is non-zero, occupation is implied */
	if (otmp == uarm)
	    return (afternmv == Armor_off || taking_off == WORN_ARMOR);
	if (otmp == uarmu)
	    return (afternmv == Shirt_off || taking_off == WORN_SHIRT);
	if (otmp == uarmc)
	    return (afternmv == Cloak_off || taking_off == WORN_CLOAK);
	if (otmp == uarmf)
	    return (afternmv == Boots_off || taking_off == WORN_BOOTS);
	if (otmp == uarmh)
	    return (afternmv == Helmet_off || taking_off == WORN_HELMET);
	if (otmp == uarmg)
	    return (afternmv == Gloves_off || taking_off == WORN_GLOVES);
	if (otmp == uarms)
	    return (afternmv == Shield_off || taking_off == WORN_SHIELD);
	return FALSE;
}